

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O0

REF_STATUS ref_clump_tri_around(REF_GRID ref_grid,REF_INT node,char *filename)

{
  REF_CELL ref_cell_00;
  uint uVar1;
  FILE *__stream;
  REF_INT local_1c0;
  REF_INT local_1bc;
  int local_1b8;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  FILE *f;
  REF_DBL jacob [9];
  REF_DBL local_128;
  REF_DBL m [6];
  REF_DBL xyz_phys [3];
  REF_DBL local_d8;
  REF_DBL xyz_comp [3];
  REF_INT local_b8;
  REF_INT local;
  REF_INT nodes [27];
  REF_INT cell_node;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_DICT tri_dict;
  REF_DICT node_dict;
  char *filename_local;
  REF_GRID pRStack_18;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_cell_00 = ref_grid->cell[3];
  node_dict = (REF_DICT)filename;
  filename_local._4_4_ = node;
  pRStack_18 = ref_grid;
  uVar1 = ref_dict_create(&tri_dict);
  if (uVar1 == 0) {
    uVar1 = ref_dict_create((REF_DICT *)&ref_cell);
    if (uVar1 == 0) {
      if ((filename_local._4_4_ < 0) || (ref_cell_00->ref_adj->nnode <= filename_local._4_4_)) {
        local_1b8 = -1;
      }
      else {
        local_1b8 = ref_cell_00->ref_adj->first[filename_local._4_4_];
      }
      cell_node = local_1b8;
      if (local_1b8 == -1) {
        local_1bc = -1;
      }
      else {
        local_1bc = ref_cell_00->ref_adj->item[local_1b8].ref;
      }
      nodes[0x1a] = local_1bc;
      while (cell_node != -1) {
        uVar1 = ref_cell_nodes(ref_cell_00,nodes[0x1a],&local_b8);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x184,"ref_clump_tri_around",(ulong)uVar1,"n");
          return uVar1;
        }
        uVar1 = ref_dict_store((REF_DICT)ref_cell,nodes[0x1a],0);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x185,"ref_clump_tri_around",(ulong)uVar1,"store");
          return uVar1;
        }
        for (nodes[0x19] = 0; nodes[0x19] < ref_cell_00->node_per; nodes[0x19] = nodes[0x19] + 1) {
          uVar1 = ref_dict_store(tri_dict,(&local_b8)[nodes[0x19]],0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x187,"ref_clump_tri_around",(ulong)uVar1,"store");
            return uVar1;
          }
        }
        cell_node = ref_cell_00->ref_adj->item[cell_node].next;
        if (cell_node == -1) {
          local_1c0 = -1;
        }
        else {
          local_1c0 = ref_cell_00->ref_adj->item[cell_node].ref;
        }
        nodes[0x1a] = local_1c0;
      }
      __stream = fopen((char *)node_dict,"w");
      if (__stream == (FILE *)0x0) {
        printf("unable to open %s\n",node_dict);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x18c,"ref_clump_tri_around","unable to open file");
        ref_grid_local._4_4_ = 2;
      }
      else {
        fprintf(__stream,"title=\"tecplot refine clump file\"\n");
        fprintf(__stream,"variables = \"x\" \"y\" \"z\"\n");
        fprintf(__stream,"zone t=\"clump\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                (ulong)(uint)tri_dict->n,(ulong)ref_cell->type,"point","fequadrilateral");
        uVar1 = ref_node_metric_get(pRStack_18->node,filename_local._4_4_,&local_128);
        if (uVar1 == 0) {
          uVar1 = ref_matrix_jacob_m(&local_128,(REF_DBL *)&f);
          if (uVar1 == 0) {
            for (cell_node = 0; cell_node < tri_dict->n; cell_node = cell_node + 1) {
              xyz_comp[2]._4_4_ = tri_dict->key[cell_node];
              m[5] = pRStack_18->node->real[xyz_comp[2]._4_4_ * 0xf] -
                     pRStack_18->node->real[filename_local._4_4_ * 0xf];
              uVar1 = ref_matrix_vect_mult((REF_DBL *)&f,m + 5,&local_d8);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                       ,0x1a0,"ref_clump_tri_around",(ulong)uVar1,"ax");
                return uVar1;
              }
              fprintf(__stream," %.16e %.16e %.16e\n",local_d8,xyz_comp[0],xyz_comp[1]);
            }
            for (cell_node = 0; cell_node < (int)ref_cell->type; cell_node = cell_node + 1) {
              nodes[0x1a] = *(REF_INT *)(*(long *)&ref_cell->edge_per + (long)cell_node * 4);
              uVar1 = ref_cell_nodes(ref_cell_00,nodes[0x1a],&local_b8);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                       ,0x1a6,"ref_clump_tri_around",(ulong)uVar1,"n");
                return uVar1;
              }
              for (nodes[0x19] = 0; nodes[0x19] < ref_cell_00->node_per;
                  nodes[0x19] = nodes[0x19] + 1) {
                uVar1 = ref_dict_location(tri_dict,(&local_b8)[nodes[0x19]],
                                          (REF_INT *)((long)xyz_comp + 0x14));
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                         ,0x1a8,"ref_clump_tri_around",(ulong)uVar1,"ret");
                  return uVar1;
                }
                fprintf(__stream," %d",(ulong)(xyz_comp[2]._4_4_ + 1));
              }
              uVar1 = ref_dict_location(tri_dict,local_b8,(REF_INT *)((long)xyz_comp + 0x14));
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                       ,0x1ab,"ref_clump_tri_around",(ulong)uVar1,"ret");
                return uVar1;
              }
              fprintf(__stream," %d",(ulong)(xyz_comp[2]._4_4_ + 1));
              fprintf(__stream,"\n");
            }
            fclose(__stream);
            uVar1 = ref_dict_free((REF_DICT)ref_cell);
            if (uVar1 == 0) {
              ref_grid_local._4_4_ = ref_dict_free(tri_dict);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                       ,0x1b3,"ref_clump_tri_around",(ulong)ref_grid_local._4_4_,"free nodes");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x1b2,"ref_clump_tri_around",(ulong)uVar1,"free tris");
              ref_grid_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x197,"ref_clump_tri_around",(ulong)uVar1,"jac");
            ref_grid_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x196,"ref_clump_tri_around",(ulong)uVar1,"get");
          ref_grid_local._4_4_ = uVar1;
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x181
             ,"ref_clump_tri_around",(ulong)uVar1,"create tris");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x180,
           "ref_clump_tri_around",(ulong)uVar1,"create nodes");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_clump_tri_around(REF_GRID ref_grid, REF_INT node,
                                        const char *filename) {
  REF_DICT node_dict, tri_dict;
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT local;
  REF_DBL xyz_comp[3], xyz_phys[3];
  REF_DBL m[6], jacob[9];

  FILE *f;

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&tri_dict), "create tris");

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(tri_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\"\n");

  fprintf(
      f,
      "zone t=\"clump\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      ref_dict_n(node_dict), ref_dict_n(tri_dict), "point", "fequadrilateral");

  RSS(ref_node_metric_get(ref_grid_node(ref_grid), node, m), "get");
  RSS(ref_matrix_jacob_m(m, jacob), "jac");
  for (item = 0; item < ref_dict_n(node_dict); item++) {
    local = ref_dict_key(node_dict, item);
    xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local) -
                  ref_node_xyz(ref_grid_node(ref_grid), 0, node);
    xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local) -
                  ref_node_xyz(ref_grid_node(ref_grid), 1, node);
    xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local) -
                  ref_node_xyz(ref_grid_node(ref_grid), 2, node);
    RSS(ref_matrix_vect_mult(jacob, xyz_phys, xyz_comp), "ax");
    fprintf(f, " %.16e %.16e %.16e\n", xyz_comp[0], xyz_comp[1], xyz_comp[2]);
  }

  for (item = 0; item < ref_dict_n(tri_dict); item++) {
    cell = ref_dict_key(tri_dict, item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
      fprintf(f, " %d", local + 1);
    }
    RSS(ref_dict_location(node_dict, nodes[0], &local), "ret");
    fprintf(f, " %d", local + 1);
    fprintf(f, "\n");
  }

  fclose(f);

  RSS(ref_dict_free(tri_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  return REF_SUCCESS;
}